

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedPipelineStateImpl.cpp
# Opt level: O2

ShaderCreateInfo * __thiscall
Diligent::SerializedPipelineStateImpl::GetPatchedShaderCreateInfo
          (ShaderCreateInfo *__return_storage_ptr__,SerializedPipelineStateImpl *this,
          ARCHIVE_DEVICE_DATA_FLAGS DeviceType,Uint32 ShaderIndex)

{
  long lVar1;
  DeviceType DVar2;
  long lVar3;
  char (*in_R8) [73];
  Uint32 ShaderIndex_local;
  string msg;
  Serializer<(Diligent::SerializerMode)0> Ser_1;
  
  ShaderIndex_local = ShaderIndex;
  if ((this->m_Status)._M_i != PIPELINE_STATE_STATUS_READY) {
    FormatString<char[17],char_const*,char[68]>
              (&msg,(Diligent *)"Pipeline state \'",(char (*) [17])&this->m_Desc,
               (char **)"\' is not ready. Use GetStatus() to check the pipeline state status.",
               (char (*) [68])in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetPatchedShaderCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x1d7);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((DeviceType ^ DeviceType - ARCHIVE_DEVICE_DATA_FLAG_D3D11) <=
      DeviceType - ARCHIVE_DEVICE_DATA_FLAG_D3D11) {
    FormatString<char[41]>(&msg,(char (*) [41])"Only single device data flag is expected");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetPatchedShaderCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x1d8);
    std::__cxx11::string::~string((string *)&msg);
  }
  ShaderCreateInfo::ShaderCreateInfo(__return_storage_ptr__);
  DVar2 = ArchiveDeviceDataFlagToArchiveDeviceType(DeviceType);
  lVar1 = (long)(this->m_Data).Shaders._M_elems[DVar2].
                super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)ShaderIndex_local <
      (ulong)(((long)(this->m_Data).Shaders._M_elems[DVar2].
                     super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish - lVar1) / 0x30)) {
    lVar3 = (ulong)ShaderIndex_local * 0x30;
    msg._M_dataplus._M_p = *(pointer *)(lVar1 + 8 + lVar3);
    msg._M_string_length = (size_type)(msg._M_dataplus._M_p + *(long *)(lVar1 + 0x10 + lVar3));
    msg.field_2._M_allocated_capacity = (size_type)msg._M_dataplus._M_p;
    ShaderSerializer<(Diligent::SerializerMode)0>::SerializeCI
              ((Serializer<(Diligent::SerializerMode)0> *)&msg,__return_storage_ptr__);
    if ((DVar2 & ~Direct3D11) == Metal_MacOS) {
      SerializedData::SerializedData
                ((SerializedData *)&msg,__return_storage_ptr__->ByteCode,
                 (__return_storage_ptr__->field_4).SourceLength);
      Ser_1.m_Start = (TPointer)msg._M_string_length;
      Ser_1.m_End = (TPointer)(msg.field_2._M_allocated_capacity + msg._M_string_length);
      Ser_1.m_Ptr = (TPointer)msg._M_string_length;
      SerializedData::~SerializedData((SerializedData *)&msg);
      Serializer<(Diligent::SerializerMode)0>::SerializeBytes
                (&Ser_1,&__return_storage_ptr__->ByteCode,
                 &(__return_storage_ptr__->field_4).SourceLength,8);
    }
  }
  else {
    FormatString<char[15],unsigned_int,char[73]>
              (&msg,(Diligent *)"Shader index (",(char (*) [15])&ShaderIndex_local,
               (uint *)") is out of range. Call GetPatchedShaderCount() to get the shader count.",
               in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetPatchedShaderCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x1ed);
    std::__cxx11::string::~string((string *)&msg);
  }
  return __return_storage_ptr__;
}

Assistant:

ShaderCreateInfo DILIGENT_CALL_TYPE SerializedPipelineStateImpl::GetPatchedShaderCreateInfo(
    ARCHIVE_DEVICE_DATA_FLAGS DeviceType,
    Uint32                    ShaderIndex) const
{
    DEV_CHECK_ERR(m_Status.load() == PIPELINE_STATE_STATUS_READY, "Pipeline state '", m_Desc.Name, "' is not ready. Use GetStatus() to check the pipeline state status.");
    DEV_CHECK_ERR(IsPowerOfTwo(DeviceType), "Only single device data flag is expected");

    ShaderCreateInfo ShaderCI;

    const auto  Type    = ArchiveDeviceDataFlagToArchiveDeviceType(DeviceType);
    const auto& Shaders = m_Data.Shaders[static_cast<size_t>(Type)];
    if (ShaderIndex < Shaders.size())
    {
        {
            Serializer<SerializerMode::Read> Ser{Shaders[ShaderIndex].Data};
            ShaderSerializer<SerializerMode::Read>::SerializeCI(Ser, ShaderCI);
        }
        if (Type == DeviceType::Metal_MacOS || Type == DeviceType::Metal_iOS)
        {
            // See DeviceObjectArchiveMtlImpl::UnpackShader and ShaderMtlSerializer<>::SerializeSource
            Serializer<SerializerMode::Read> Ser{SerializedData{const_cast<void*>(ShaderCI.ByteCode), ShaderCI.ByteCodeSize}};
            Ser.SerializeBytes(ShaderCI.ByteCode, ShaderCI.ByteCodeSize);
        }
    }
    else
    {
        DEV_ERROR("Shader index (", ShaderIndex, ") is out of range. Call GetPatchedShaderCount() to get the shader count.");
    }

    return ShaderCI;
}